

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathNative.cpp
# Opt level: O2

PackageInfo * chatra::emb::math::packageInfo(void)

{
  long lVar1;
  PackageInfo *in_RDI;
  initializer_list<chatra::Script> __l;
  initializer_list<chatra::NativeCallHandlerInfo> __l_00;
  NativeCallHandlerInfo local_1a50 [4];
  NativeCallHandlerInfo local_18b0;
  NativeCallHandlerInfo local_1848;
  NativeCallHandlerInfo local_17e0;
  NativeCallHandlerInfo local_1778;
  NativeCallHandlerInfo local_1710;
  NativeCallHandlerInfo local_16a8;
  NativeCallHandlerInfo local_1640;
  NativeCallHandlerInfo local_15d8;
  NativeCallHandlerInfo local_1570;
  NativeCallHandlerInfo local_1508;
  NativeCallHandlerInfo local_14a0;
  NativeCallHandlerInfo local_1438;
  NativeCallHandlerInfo local_13d0;
  NativeCallHandlerInfo local_1368;
  NativeCallHandlerInfo local_1300;
  NativeCallHandlerInfo local_1298;
  NativeCallHandlerInfo local_1230;
  NativeCallHandlerInfo local_11c8;
  NativeCallHandlerInfo local_1160;
  NativeCallHandlerInfo local_10f8;
  NativeCallHandlerInfo local_1090;
  NativeCallHandlerInfo local_1028;
  NativeCallHandlerInfo local_fc0;
  NativeCallHandlerInfo local_f58;
  NativeCallHandlerInfo local_ef0;
  NativeCallHandlerInfo local_e88;
  NativeCallHandlerInfo local_e20;
  NativeCallHandlerInfo local_db8;
  NativeCallHandlerInfo local_d50;
  NativeCallHandlerInfo local_ce8;
  NativeCallHandlerInfo local_c80;
  NativeCallHandlerInfo local_c18;
  NativeCallHandlerInfo local_bb0;
  NativeCallHandlerInfo local_b48;
  NativeCallHandlerInfo local_ae0;
  NativeCallHandlerInfo local_a78;
  NativeCallHandlerInfo local_a10;
  NativeCallHandlerInfo local_9a8;
  NativeCallHandlerInfo local_940;
  NativeCallHandlerInfo local_8d8;
  NativeCallHandlerInfo local_870;
  NativeCallHandlerInfo local_808;
  NativeCallHandlerInfo local_7a0;
  NativeCallHandlerInfo local_738;
  string local_6d0;
  string local_6b0;
  string local_690;
  string local_670;
  string local_650;
  string local_630;
  string local_610;
  string local_5f0;
  string local_5d0;
  string local_5b0;
  string local_590;
  string local_570;
  string local_550;
  string local_530;
  string local_510;
  string local_4f0;
  string local_4d0;
  string local_4b0;
  string local_490;
  string local_470;
  string local_450;
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  undefined1 local_90 [8];
  vector<chatra::Script,_std::allocator<chatra::Script>_> scripts;
  vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_> handlers;
  allocator local_58;
  allocator local_57;
  allocator local_56;
  allocator local_55;
  allocator local_54;
  allocator local_53;
  allocator local_52;
  allocator local_51;
  allocator local_50;
  allocator local_4f;
  allocator local_4e;
  allocator local_4d;
  allocator local_4c;
  allocator local_4b;
  allocator local_4a;
  allocator local_49;
  allocator local_48;
  allocator local_47;
  allocator local_46;
  allocator local_45;
  allocator local_44;
  allocator local_43;
  allocator local_42;
  allocator local_41;
  allocator local_40;
  allocator local_3f;
  allocator local_3e;
  allocator local_3d;
  allocator local_3c;
  allocator local_3b;
  allocator local_3a;
  allocator local_39;
  allocator local_38;
  allocator local_37;
  allocator local_36;
  allocator local_35;
  allocator local_34;
  allocator local_33;
  allocator local_32;
  allocator local_31;
  allocator local_30;
  allocator local_2f;
  allocator local_2e;
  allocator local_2d;
  allocator local_2c;
  allocator_type local_2b;
  allocator local_2a;
  allocator_type local_29;
  
  std::__cxx11::string::string
            ((string *)&local_6d0,"math",
             (allocator *)
             &scripts.super__Vector_base<chatra::Script,_std::allocator<chatra::Script>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::string
            ((string *)&local_6b0,
             "\n/*\n * Programming language \'Chatra\' reference implementation\n *\n * Copyright(C) 2020 Chatra Project Team\n *\n * Licensed under the Apache License, Version 2.0 (the \"License\");\n * you may not use this file except in compliance with the License.\n * You may obtain a copy of the License at\n *\n *   http://www.apache.org/licenses/LICENSE-2.0\n *\n * Unless required by applicable law or agreed to in writing, software\n * distributed under the License is distributed on an \"AS IS\" BASIS,\n * WITHOUT WARRANTIES OR CONDITIONS OF ANY KIND, either express or implied.\n * See the License for the specific language governing permissions and\n * limitations under the License.\n *\n * author: Satoshi Hosokawa (chatra.hosokawa@gmail.com)\n */\n\ndef sin(v) as native\ndef cos(v) as native\ndef tan(v) as native\ndef asin(v) as native\ndef acos(v) as native\ndef atan(v) as native\ndef atan2(y, x) as native\n\ndef sinh(v) as native\ndef cosh(v) as native\ndef tanh(v) as native\ndef asinh(v) as native\ndef acosh(v) as native\ndef atanh(v) as native\n\ndef exp(v) as native\ndef exp2(v) as native\ndef expm1(v) as native\ndef logn(v) as native\ndef log10(v) as native\ndef log1p(v) as native\ndef log2(v) as native\n\ndef ldexp(v, exp) as native\n\ndef _native_frexp_fraction(v) as native\ndef _native_frexp_exponent(v) as native\ndef frexp(v)\n\treturn _native_frexp_fraction(v), _native_frexp_exponent(v)\n\ndef ilogb(v) as native\ndef logb(v) as native\n\ndef _native_modf_integral(v) as native\ndef _native_modf_fractional(v) as native\ndef modf(v)\n\treturn _native_modf_integral(v), _native_modf_fractional(v)\n\ndef scalbn(v, exp)\n\treturn ldexp(v, exp)\n\ndef pow(x, y) as native\ndef sqrt(v) as native\ndef cbrt(v) as native\ndef hypot(x, y) as native\ndef abs(v) as native\n\ndef erf(v) as native\ndef erfc(v) as native\ndef tgamma(v) as native\ndef lgamma(v) as native\n\ndef ceil(v) as native\ndef floor(v) as native\ndef trunc(v) as native\ndef round(v) as native\n\ndef mod(x, y) as native\ndef remainder(x, y) as native\n\ndef nextafter(x, y) as native\n\ndef isfinite(v) as native\ndef isinf(v) as native\ndef isnan(v)..." /* TRUNCATED STRING LITERAL */
             ,&local_2a);
  Script::Script((Script *)local_1a50,&local_6d0,&local_6b0);
  __l._M_len = 1;
  __l._M_array = (iterator)local_1a50;
  std::vector<chatra::Script,_std::allocator<chatra::Script>_>::vector
            ((vector<chatra::Script,_std::allocator<chatra::Script>_> *)local_90,__l,&local_29);
  Script::~Script((Script *)local_1a50);
  std::__cxx11::string::~string((string *)&local_6b0);
  std::__cxx11::string::~string((string *)&local_6d0);
  std::__cxx11::string::string((string *)&local_690,"sin",&local_2a);
  NativeCallHandlerInfo::NativeCallHandlerInfo(local_1a50,math_sin,&local_690);
  std::__cxx11::string::string((string *)&local_670,"cos",(allocator *)&local_29);
  NativeCallHandlerInfo::NativeCallHandlerInfo(local_1a50 + 1,math_cos,&local_670);
  std::__cxx11::string::string
            ((string *)&local_650,"tan",
             (allocator *)
             ((long)&handlers.
                     super__Vector_base<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  NativeCallHandlerInfo::NativeCallHandlerInfo(local_1a50 + 2,math_tan,&local_650);
  std::__cxx11::string::string((string *)&local_630,"asin",&local_58);
  NativeCallHandlerInfo::NativeCallHandlerInfo(local_1a50 + 3,math_asin,&local_630);
  std::__cxx11::string::string((string *)&local_610,"acos",&local_57);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_18b0,math_acos,&local_610);
  std::__cxx11::string::string((string *)&local_5f0,"atan",&local_56);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_1848,math_atan,&local_5f0);
  std::__cxx11::string::string((string *)&local_5d0,"atan2",&local_55);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_17e0,math_atan2,&local_5d0);
  std::__cxx11::string::string((string *)&local_5b0,"sinh",&local_54);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_1778,math_sinh,&local_5b0);
  std::__cxx11::string::string((string *)&local_590,"cosh",&local_53);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_1710,math_cosh,&local_590);
  std::__cxx11::string::string((string *)&local_570,"tanh",&local_52);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_16a8,math_tanh,&local_570);
  std::__cxx11::string::string((string *)&local_550,"asinh",&local_51);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_1640,math_asinh,&local_550);
  std::__cxx11::string::string((string *)&local_530,"acosh",&local_50);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_15d8,math_acosh,&local_530);
  std::__cxx11::string::string((string *)&local_510,"atanh",&local_4f);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_1570,math_atanh,&local_510);
  std::__cxx11::string::string((string *)&local_4f0,"exp",&local_4e);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_1508,math_exp,&local_4f0);
  std::__cxx11::string::string((string *)&local_4d0,"exp2",&local_4d);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_14a0,math_exp2,&local_4d0);
  std::__cxx11::string::string((string *)&local_4b0,"expm1",&local_4c);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_1438,math_expm1,&local_4b0);
  std::__cxx11::string::string((string *)&local_490,"logn",&local_4b);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_13d0,math_logn,&local_490);
  std::__cxx11::string::string((string *)&local_470,"log10",&local_4a);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_1368,math_log10,&local_470);
  std::__cxx11::string::string((string *)&local_450,"log1p",&local_49);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_1300,math_log1p,&local_450);
  std::__cxx11::string::string((string *)&local_430,"log2",&local_48);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_1298,math_log2,&local_430);
  std::__cxx11::string::string((string *)&local_410,"ldexp",&local_47);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_1230,math_ldexp,&local_410);
  std::__cxx11::string::string((string *)&local_3f0,"_native_frexp_fraction",&local_46);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_11c8,math_frexp_fraction,&local_3f0);
  std::__cxx11::string::string((string *)&local_3d0,"_native_frexp_exponent",&local_45);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_1160,math_frexp_exponent,&local_3d0);
  std::__cxx11::string::string((string *)&local_3b0,"ilogb",&local_44);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_10f8,math_ilogb,&local_3b0);
  std::__cxx11::string::string((string *)&local_390,"logb",&local_43);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_1090,math_logb,&local_390);
  std::__cxx11::string::string((string *)&local_370,"_native_modf_integral",&local_42);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_1028,math_modf_integral,&local_370);
  std::__cxx11::string::string((string *)&local_350,"_native_modf_fractional",&local_41);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_fc0,math_modf_fractional,&local_350);
  std::__cxx11::string::string((string *)&local_330,"pow",&local_40);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_f58,math_pow,&local_330);
  std::__cxx11::string::string((string *)&local_310,"sqrt",&local_3f);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_ef0,math_sqrt,&local_310);
  std::__cxx11::string::string((string *)&local_2f0,"cbrt",&local_3e);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_e88,math_cbrt,&local_2f0);
  std::__cxx11::string::string((string *)&local_2d0,"hypot",&local_3d);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_e20,math_hypot,&local_2d0);
  std::__cxx11::string::string((string *)&local_2b0,"abs",&local_3c);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_db8,math_abs,&local_2b0);
  std::__cxx11::string::string((string *)&local_290,"erf",&local_3b);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_d50,math_erf,&local_290);
  std::__cxx11::string::string((string *)&local_270,"erfc",&local_3a);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_ce8,math_erfc,&local_270);
  std::__cxx11::string::string((string *)&local_250,"tgamma",&local_39);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_c80,math_tgamma,&local_250);
  std::__cxx11::string::string((string *)&local_230,"lgamma",&local_38);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_c18,math_lgamma,&local_230);
  std::__cxx11::string::string((string *)&local_210,"ceil",&local_37);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_bb0,math_ceil,&local_210);
  std::__cxx11::string::string((string *)&local_1f0,"floor",&local_36);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_b48,math_floor,&local_1f0);
  std::__cxx11::string::string((string *)&local_1d0,"trunc",&local_35);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_ae0,math_trunc,&local_1d0);
  std::__cxx11::string::string((string *)&local_1b0,"round",&local_34);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_a78,math_round,&local_1b0);
  std::__cxx11::string::string((string *)&local_190,"mod",&local_33);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_a10,math_mod,&local_190);
  std::__cxx11::string::string((string *)&local_170,"remainder",&local_32);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_9a8,math_remainder,&local_170);
  std::__cxx11::string::string((string *)&local_150,"nextafter",&local_31);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_940,math_nextafter,&local_150);
  std::__cxx11::string::string((string *)&local_130,"isfinite",&local_30);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_8d8,math_isfinite,&local_130);
  std::__cxx11::string::string((string *)&local_110,"isinf",&local_2f);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_870,math_isinf,&local_110);
  std::__cxx11::string::string((string *)&local_f0,"isnan",&local_2e);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_808,math_isnan,&local_f0);
  std::__cxx11::string::string((string *)&local_d0,"isnormal",&local_2d);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_7a0,math_isnormal,&local_d0);
  std::__cxx11::string::string((string *)&local_b0,"signbit",&local_2c);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_738,math_signbit,&local_b0);
  __l_00._M_len = 0x30;
  __l_00._M_array = local_1a50;
  std::vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>::vector
            ((vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>
              *)&scripts.super__Vector_base<chatra::Script,_std::allocator<chatra::Script>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage,__l_00,&local_2b);
  lVar1 = 0x1318;
  do {
    NativeCallHandlerInfo::~NativeCallHandlerInfo
              ((NativeCallHandlerInfo *)((long)&local_1a50[0].handler + lVar1));
    lVar1 = lVar1 + -0x68;
  } while (lVar1 != -0x68);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::string::~string((string *)&local_350);
  std::__cxx11::string::~string((string *)&local_370);
  std::__cxx11::string::~string((string *)&local_390);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::__cxx11::string::~string((string *)&local_410);
  std::__cxx11::string::~string((string *)&local_430);
  std::__cxx11::string::~string((string *)&local_450);
  std::__cxx11::string::~string((string *)&local_470);
  std::__cxx11::string::~string((string *)&local_490);
  std::__cxx11::string::~string((string *)&local_4b0);
  std::__cxx11::string::~string((string *)&local_4d0);
  std::__cxx11::string::~string((string *)&local_4f0);
  std::__cxx11::string::~string((string *)&local_510);
  std::__cxx11::string::~string((string *)&local_530);
  std::__cxx11::string::~string((string *)&local_550);
  std::__cxx11::string::~string((string *)&local_570);
  std::__cxx11::string::~string((string *)&local_590);
  std::__cxx11::string::~string((string *)&local_5b0);
  std::__cxx11::string::~string((string *)&local_5d0);
  std::__cxx11::string::~string((string *)&local_5f0);
  std::__cxx11::string::~string((string *)&local_610);
  std::__cxx11::string::~string((string *)&local_630);
  std::__cxx11::string::~string((string *)&local_650);
  std::__cxx11::string::~string((string *)&local_670);
  std::__cxx11::string::~string((string *)&local_690);
  std::vector<chatra::Script,_std::allocator<chatra::Script>_>::vector
            (&in_RDI->scripts,(vector<chatra::Script,_std::allocator<chatra::Script>_> *)local_90);
  std::vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>::vector
            (&in_RDI->handlers,
             (vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>
              *)&scripts.super__Vector_base<chatra::Script,_std::allocator<chatra::Script>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage);
  (in_RDI->interface).super___shared_ptr<chatra::IPackage,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (in_RDI->interface).super___shared_ptr<chatra::IPackage,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>::
  ~vector((vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_> *)
          &scripts.super__Vector_base<chatra::Script,_std::allocator<chatra::Script>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage);
  std::vector<chatra::Script,_std::allocator<chatra::Script>_>::~vector
            ((vector<chatra::Script,_std::allocator<chatra::Script>_> *)local_90);
  return in_RDI;
}

Assistant:

PackageInfo packageInfo() {
	std::vector<Script> scripts = {{"math", script}};
	std::vector<HandlerInfo> handlers = {
			{math_sin, "sin"},
			{math_cos, "cos"},
			{math_tan, "tan"},
			{math_asin, "asin"},
			{math_acos, "acos"},
			{math_atan, "atan"},
			{math_atan2, "atan2"},

			{math_sinh, "sinh"},
			{math_cosh, "cosh"},
			{math_tanh, "tanh"},
			{math_asinh, "asinh"},
			{math_acosh, "acosh"},
			{math_atanh, "atanh"},

			{math_exp, "exp"},
			{math_exp2, "exp2"},
			{math_expm1, "expm1"},
			{math_logn, "logn"},
			{math_log10, "log10"},
			{math_log1p, "log1p"},
			{math_log2, "log2"},

			{math_ldexp, "ldexp"},
			{math_frexp_fraction, "_native_frexp_fraction"},
			{math_frexp_exponent, "_native_frexp_exponent"},
			{math_ilogb, "ilogb"},
			{math_logb, "logb"},
			{math_modf_integral, "_native_modf_integral"},
			{math_modf_fractional, "_native_modf_fractional"},

			{math_pow, "pow"},
			{math_sqrt, "sqrt"},
			{math_cbrt, "cbrt"},
			{math_hypot, "hypot"},
			{math_abs, "abs"},

			{math_erf, "erf"},
			{math_erfc, "erfc"},
			{math_tgamma, "tgamma"},
			{math_lgamma, "lgamma"},

			{math_ceil, "ceil"},
			{math_floor, "floor"},
			{math_trunc, "trunc"},
			{math_round, "round"},

			{math_mod, "mod"},
			{math_remainder, "remainder"},
			{math_nextafter, "nextafter"},

			{math_isfinite, "isfinite"},
			{math_isinf, "isinf"},
			{math_isnan, "isnan"},
			{math_isnormal, "isnormal"},
			{math_signbit, "signbit"},
	};
	return {scripts, handlers, nullptr};
}